

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall asl::Array<asl::InetAddress>::free(Array<asl::InetAddress> *this,void *__ptr)

{
  int *piVar1;
  long lVar2;
  InetAddress *pIVar3;
  long lVar4;
  
  pIVar3 = this->_a;
  lVar4 = (long)*(int *)&pIVar3[-1]._data._a;
  if (lVar4 != 0) {
    lVar2 = 0;
    do {
      LOCK();
      piVar1 = (int *)(*(long *)((long)&(pIVar3->_data)._a + lVar2) + -8);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        ::free((void *)(*(long *)((long)&(pIVar3->_data)._a + lVar2) + -0x10));
        *(undefined8 *)((long)&(pIVar3->_data)._a + lVar2) = 0;
      }
      lVar2 = lVar2 + 0x10;
    } while (lVar4 * 0x10 != lVar2);
    pIVar3 = this->_a;
  }
  ::free(pIVar3 + -1);
  this->_a = (InetAddress *)0x0;
  return;
}

Assistant:

void Array<T>::free()
{
	asl_destroy(_a, d().n);
	ASL_RC_FREE();
	::free( (char*)_a - sizeof(Data) );
	_a=0;
}